

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O2

char ** apprun_string_list_dup(char **list)

{
  uint size;
  char **target;
  
  if (list == (char **)0x0) {
    target = (char **)0x0;
  }
  else {
    size = apprun_array_len(list);
    target = apprun_string_list_alloc(size);
    apprun_string_list_copy(list,target);
  }
  return target;
}

Assistant:

char **apprun_string_list_dup(char *const *list) {
    if (list != NULL) {
        unsigned size = apprun_array_len(list);
        char **copy = apprun_string_list_alloc(size);

        apprun_string_list_copy(list, copy);

        return copy;
    } else
        return NULL;
}